

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

QString * __thiscall
QWidgetLineControl::stripString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,QString *str)

{
  uint uVar1;
  type pMVar2;
  ulong uVar3;
  size_t __i;
  
  if (*(long *)(this + 0xe8) == 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    uVar1 = (uint)(str->d).size;
    if ((int)*(uint *)(this + 0x60) < (int)uVar1) {
      uVar1 = *(uint *)(this + 0x60);
    }
    __i = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = __i;
    }
    for (; uVar3 != __i; __i = __i + 1) {
      pMVar2 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)(this + 0xe8),__i);
      if (pMVar2->separator == true) {
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)(this + 0xe8),__i);
LAB_003f7f1e:
        QString::append((QChar)(char16_t)__return_storage_ptr__);
      }
      else if ((str->d).ptr[__i] != *(char16_t *)(this + 0xe0)) goto LAB_003f7f1e;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::stripString(const QString &str) const
{
    if (!m_maskData)
        return str;

    QString s;
    int end = qMin(m_maxLength, (int)str.size());
    for (int i = 0; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            if (str[i] != m_blank)
                s += str[i];

    return s;
}